

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsembleValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)402>(Result *__return_storage_ptr__,Model *format)

{
  logic_error *error;
  shared_ptr<CoreML::TreeEnsembles::_TreeEnsemble> local_28;
  Model *local_18;
  Model *format_local;
  
  local_18 = format;
  format_local = (Model *)__return_storage_ptr__;
  TreeEnsembles::constructAndValidateTreeEnsembleFromSpec((TreeEnsembles *)&local_28,format);
  std::shared_ptr<CoreML::TreeEnsembles::_TreeEnsemble>::~shared_ptr(&local_28);
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_treeEnsembleClassifier>(const Specification::Model& format) {
        try {
            TreeEnsembles::constructAndValidateTreeEnsembleFromSpec(format);

        } catch (const std::logic_error& error) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, error.what());
        }

        return Result();
    }